

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O3

void expand(TidyPrintImpl *pprint,uint len)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint *puVar4;
  
  uVar2 = 0x100;
  if (pprint->lbufsize != 0) {
    uVar2 = (ulong)pprint->lbufsize;
  }
  do {
    uVar3 = uVar2;
    uVar1 = (uint)uVar3;
    uVar2 = (ulong)(uVar1 * 2);
  } while (uVar1 <= len);
  puVar4 = (uint *)(*pprint->allocator->vtbl->realloc)(pprint->allocator,pprint->linebuf,uVar3 << 2)
  ;
  if (puVar4 != (uint *)0x0) {
    memset(puVar4 + pprint->lbufsize,0,(ulong)(uVar1 - pprint->lbufsize) << 2);
    pprint->lbufsize = uVar1;
    pprint->linebuf = puVar4;
  }
  return;
}

Assistant:

static void expand( TidyPrintImpl* pprint, uint len )
{
    uint* ip;
    uint buflen = pprint->lbufsize;

    if ( buflen == 0 )
        buflen = 256;
    while ( len >= buflen )
        buflen *= 2;

    ip = (uint*) TidyRealloc( pprint->allocator, pprint->linebuf, buflen*sizeof(uint) );
    if ( ip )
    {
      TidyClearMemory( ip+pprint->lbufsize, 
                       (buflen-pprint->lbufsize)*sizeof(uint) );
      pprint->lbufsize = buflen;
      pprint->linebuf = ip;
    }
}